

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

bool __thiscall fasttext::FastText::checkModel(FastText *this,istream *in)

{
  bool bVar1;
  int32_t magic;
  
  std::istream::read((char *)in,(long)&magic);
  if (magic == 0x2f4f16ba) {
    std::istream::read((char *)in,(long)&this->version);
    bVar1 = this->version < 0xd;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FastText::checkModel(std::istream& in) {
	int32_t magic;
	in.read((char*)&(magic), sizeof(int32_t));
	if (magic != FASTTEXT_FILEFORMAT_MAGIC_INT32) {
		return false;
	}
	in.read((char*)&(version), sizeof(int32_t));
	if (version > FASTTEXT_VERSION) {
		return false;
	}
	return true;
}